

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int trsrch_ddl(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double *dx,
              double maxstep,int iter,double *L,double *hess,double stol,double *ioval,double *x)

{
  void *__ptr;
  double *step_00;
  double *xprev_00;
  double *ssd_00;
  double *v_00;
  double *v;
  double *ssd;
  double *xprev;
  double *step;
  double *temp;
  double funcprev;
  double nlen;
  int local_78;
  int method;
  int i;
  int retval;
  double stol_local;
  double maxstep_local;
  double *dx_local;
  double *pdStack_50;
  int N_local;
  double *sN_local;
  double *jac_local;
  double *xi_local;
  custom_function *funcpt_local;
  
  method = 4;
  funcprev = 0.0;
  ioval[7] = 1.0;
  nlen._4_4_ = 1;
  _i = stol;
  stol_local = maxstep;
  maxstep_local = (double)dx;
  dx_local._4_4_ = N;
  pdStack_50 = sN;
  sN_local = jac;
  jac_local = xi;
  xi_local = (double *)funcpt;
  __ptr = malloc((long)N << 3);
  step_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  xprev_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  ssd_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  v_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  for (local_78 = 0; local_78 < dx_local._4_4_; local_78 = local_78 + 1) {
    funcprev = *(double *)((long)maxstep_local + (long)local_78 * 8) * pdStack_50[local_78] *
               *(double *)((long)maxstep_local + (long)local_78 * 8) * pdStack_50[local_78] +
               funcprev;
  }
  funcprev = sqrt(funcprev);
  temp = (double *)0x0;
  for (; 1 < method && method != 0xf;
      method = trupdate((custom_function *)xi_local,jac_local,sN_local,step_00,dx_local._4_4_,
                        (double *)maxstep_local,stol_local,method,L,hess,_i,nlen._4_4_,ioval,
                        xprev_00,(double *)&temp,x)) {
    trstep_ddl(sN_local,pdStack_50,dx_local._4_4_,(double *)maxstep_local,stol_local,L,hess,funcprev
               ,ioval,ssd_00,v_00,step_00);
  }
  free(__ptr);
  free(step_00);
  free(xprev_00);
  free(ssd_00);
  free(v_00);
  return method;
}

Assistant:

int trsrch_ddl(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double * dx,double maxstep,
		int iter,double *L,double *hess,double stol,double *ioval,double *x) {
	int retval,i,method;		
	double nlen,funcprev;
	double *temp,*step,*xprev,*ssd,*v;
	/*
	 * ioval[0] = delta; [trust region current radius]
	 * ioval[1] = cauchy step length;
	 * ioval[2]-ioval[5] dummy constants;
	 * ioval[6] and ioval[7] are "binary" flags.
	 */ 
	retval = 4;
	nlen = 0.0;
	ioval[7] = 1.0;
	method = 1;
	temp = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	xprev = (double*) malloc(sizeof(double) *N);
	ssd = (double*) malloc(sizeof(double) *N);
	v = (double*) malloc(sizeof(double) *N);
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * sN[i] * dx[i] * sN[i];
	}
	nlen = sqrt(nlen);
	funcprev = 0.0;
	
	while (retval >= 2 && retval != 15) {
		trstep_ddl(jac,sN,N,dx,maxstep,L,hess,nlen,ioval,ssd,v,step);
		retval = trupdate(funcpt,xi,jac,step,N,dx,maxstep,retval,L,hess,stol,method,ioval,xprev,&funcprev,x);
	}
	 
	free(temp); 
	free(step);
	free(xprev);
	free(ssd);
	free(v);
	return retval;

}